

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_simd_3same_pair
               (DisasContext_conflict1 *s,int is_q,int u,int opcode,int size,int rn,int rm,int rd)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  int iVar2;
  DisasContext_conflict1 *pDVar3;
  bool bVar4;
  int iVar5;
  uintptr_t o_20;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  TCGTemp **ppTVar8;
  NeonGenTwoOpFn **ppNVar9;
  TCGTemp *pTVar10;
  bool bVar11;
  uintptr_t o_1;
  long lVar12;
  TCGv_i32 pTVar13;
  uint uVar14;
  code *pcVar15;
  ulong uVar16;
  uintptr_t o_19;
  uint uVar17;
  uintptr_t o;
  long lVar18;
  TCGArg a3;
  uintptr_t o_35;
  TCGv_i64 ret;
  TCGv_i32 pTVar19;
  TCGv_i32 tcg_res [4];
  TCGTemp *local_c8;
  TCGv_i32 local_c0;
  TCGv_i64 local_b8;
  TCGv_i64 local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  TCGTemp *local_98;
  long local_90;
  TCGv_i64 local_88;
  DisasContext_conflict1 *local_70;
  TCGTemp *local_68;
  TCGv_i64 local_60;
  NeonGenTwoOpFn **local_58;
  NeonGenTwoOpFn **local_50;
  NeonGenTwoOpFn **local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  local_a8 = rd;
  local_a0 = rm;
  s_00 = s->uc->tcg_ctx;
  local_9c = rn;
  if (opcode < 0x58) {
    ret = (TCGv_i64)0x0;
  }
  else {
    pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar6 - (long)s_00);
    tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ec8);
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  local_a4 = opcode;
  local_70 = s;
  local_60 = ret;
  if (size == 3) {
    ppTVar8 = &local_c8;
    bVar4 = true;
    do {
      bVar11 = bVar4;
      local_68 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      lVar18 = (long)local_68 - (long)s_00;
      pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pDVar3 = local_70;
      lVar12 = (long)pTVar6 - (long)s_00;
      iVar5 = local_a0;
      if (bVar11) {
        iVar5 = local_9c;
      }
      pTVar1 = local_70->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar18,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(long)(iVar5 * 0x100 + 0xc10));
      pTVar1 = pDVar3->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar12,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(long)(iVar5 * 0x100 + 0xc18));
      pTVar7 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pTVar10 = (TCGTemp *)((long)pTVar7 - (long)s_00);
      *ppTVar8 = pTVar10;
      if (local_a4 < 0x5e) {
        if (local_a4 == 0x17) {
          tcg_gen_op3_aarch64(s_00,INDEX_op_add_i64,(TCGArg)pTVar7,(TCGArg)local_68,(TCGArg)pTVar6);
        }
        else {
          if (local_a4 == 0x58) {
            pcVar15 = helper_vfp_maxnumd_aarch64;
          }
          else {
            if (local_a4 != 0x5a) {
LAB_006b19e4:
              iVar5 = 0x2bfd;
LAB_006b19fe:
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                         ,iVar5,(char *)0x0);
            }
            pcVar15 = helper_vfp_addd_aarch64;
          }
LAB_006b14be:
          local_90 = (long)s_00 + lVar12;
          local_98 = (TCGTemp *)((long)s_00 + lVar18);
          local_88 = ret + (long)&s_00->pool_cur;
          tcg_gen_callN_aarch64
                    (s_00,pcVar15,(TCGTemp *)((long)&s_00->pool_cur + (long)&pTVar10->field_0x0),3,
                     &local_98);
        }
      }
      else {
        if (local_a4 != 0x5e) {
          if (local_a4 == 0x78) {
            pcVar15 = helper_vfp_minnumd_aarch64;
          }
          else {
            if (local_a4 != 0x7e) goto LAB_006b19e4;
            pcVar15 = helper_vfp_mind_aarch64;
          }
          goto LAB_006b14be;
        }
        local_98 = (TCGTemp *)((long)s_00 + lVar18);
        local_90 = (long)s_00 + lVar12;
        local_88 = ret + (long)&s_00->pool_cur;
        tcg_gen_callN_aarch64
                  (s_00,helper_vfp_maxd_aarch64,
                   (TCGTemp *)((long)&s_00->pool_cur + (long)&pTVar10->field_0x0),3,&local_98);
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar18 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar12 + (long)s_00));
      pDVar3 = local_70;
      ppTVar8 = &local_38;
      bVar4 = false;
    } while (bVar11);
    iVar5 = local_a8 * 0x100;
    uVar16 = 0;
    ppTVar8 = &local_c8;
    bVar4 = true;
    do {
      bVar11 = bVar4;
      pTVar6 = *ppTVar8;
      pTVar1 = pDVar3->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(long)&pTVar1->pool_cur + (long)pTVar6,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),uVar16 | (long)(iVar5 + 0xc10));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((long)&s_00->pool_cur + (long)pTVar6));
      uVar16 = 8;
      ppTVar8 = &local_38;
      bVar4 = false;
    } while (bVar11);
  }
  else {
    uVar14 = (uint)(is_q != 0) * 2 + 2;
    local_40 = (TCGTemp *)(ulong)(uVar14 >> 1);
    local_b0 = ret + (long)&s_00->pool_cur;
    local_48 = handle_simd_3same_pair::fns + (uint)size;
    local_58 = handle_simd_3same_pair::fns_2[(uint)size] + (uint)u;
    local_50 = handle_simd_3same_pair::fns_1[(uint)size] + (uint)u;
    pTVar6 = (TCGTemp *)0x0;
    do {
      local_68 = pTVar6;
      pTVar7 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar13 = (TCGv_i32)((long)pTVar7 - (long)s_00);
      pTVar7 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pDVar3 = local_70;
      pTVar19 = (TCGv_i32)((long)pTVar7 - (long)s_00);
      iVar5 = local_a0;
      if (pTVar6 < local_40) {
        iVar5 = local_9c;
      }
      uVar17 = (uint)((byte)pTVar6 & is_q != 0);
      pTVar1 = local_70->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i32,(TCGArg)((long)pTVar1 + (long)pTVar13),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (long)(int)(iVar5 * 0x100 + uVar17 * 8 + 0xc10));
      iVar2 = local_a4;
      pTVar1 = pDVar3->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i32,(TCGArg)((long)pTVar1 + (long)pTVar19),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (long)(int)(iVar5 * 0x100 + uVar17 * 8 + 0xc14));
      pTVar7 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar6 = local_68;
      pTVar7 = (TCGTemp *)((long)pTVar7 - (long)s_00);
      (&local_98)[(long)local_68] = pTVar7;
      if (iVar2 < 0x5a) {
        if (iVar2 < 0x17) {
          ppNVar9 = local_50;
          if ((iVar2 == 0x14) || (ppNVar9 = local_58, iVar2 == 0x15)) {
LAB_006b180d:
            if (*ppNVar9 != (NeonGenTwoOpFn *)0x0) {
              (**ppNVar9)(s_00,(TCGv_i32)pTVar7,pTVar13,pTVar19);
            }
            goto LAB_006b18e2;
          }
        }
        else {
          ppNVar9 = local_48;
          if (iVar2 == 0x17) goto LAB_006b180d;
          if (iVar2 == 0x58) {
            pcVar15 = helper_vfp_maxnums_aarch64;
            goto LAB_006b18d0;
          }
        }
LAB_006b19f2:
        iVar5 = 0x2c47;
        goto LAB_006b19fe;
      }
      if (iVar2 < 0x78) {
        if (iVar2 == 0x5a) {
          pcVar15 = helper_vfp_adds_aarch64;
        }
        else {
          if (iVar2 != 0x5e) goto LAB_006b19f2;
          pcVar15 = helper_vfp_maxs_aarch64;
        }
      }
      else if (iVar2 == 0x78) {
        pcVar15 = helper_vfp_minnums_aarch64;
      }
      else {
        if (iVar2 != 0x7e) goto LAB_006b19f2;
        pcVar15 = helper_vfp_mins_aarch64;
      }
LAB_006b18d0:
      local_c0 = (TCGv_i32)((long)s_00 + (long)pTVar19);
      local_c8 = (TCGTemp *)((long)s_00 + (long)pTVar13);
      local_b8 = local_b0;
      tcg_gen_callN_aarch64
                (s_00,pcVar15,(TCGTemp *)((long)&s_00->pool_cur + (long)&pTVar7->field_0x0),3,
                 &local_c8);
LAB_006b18e2:
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar13 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar19 + (long)s_00));
      pDVar3 = local_70;
      pTVar6 = (TCGTemp *)&pTVar6->field_0x1;
    } while ((TCGTemp *)(ulong)uVar14 != pTVar6);
    a3 = (TCGArg)(local_a8 * 0x100 + 0xc10);
    lVar12 = 0;
    do {
      pTVar6 = (&local_98)[lVar12];
      pTVar1 = pDVar3->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(long)&pTVar1->pool_cur + (long)pTVar6,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),a3);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((long)&s_00->pool_cur + (long)pTVar6));
      lVar12 = lVar12 + 1;
      a3 = a3 + 4;
    } while ((undefined1 *)(ulong)uVar14 != (undefined1 *)lVar12);
    clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)pDVar3->sve_len,
                   SUB81(pDVar3->uc->tcg_ctx,0),(uint)(is_q != 0));
  }
  if (local_60 != (TCGv_i64)0x0) {
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(local_60 + (long)s_00));
  }
  return;
}

Assistant:

static void handle_simd_3same_pair(DisasContext *s, int is_q, int u, int opcode,
                                   int size, int rn, int rm, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    int pass;

    /* Floating point operations need fpst */
    if (opcode >= 0x58) {
        fpst = get_fpstatus_ptr(tcg_ctx, false);
    } else {
        fpst = NULL;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* These operations work on the concatenated rm:rn, with each pair of
     * adjacent elements being operated on to produce an element in the result.
     */
    if (size == 3) {
        TCGv_i64 tcg_res[2];

        for (pass = 0; pass < 2; pass++) {
            TCGv_i64 tcg_op1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_op2 = tcg_temp_new_i64(tcg_ctx);
            int passreg = (pass == 0) ? rn : rm;

            read_vec_element(s, tcg_op1, passreg, 0, MO_64);
            read_vec_element(s, tcg_op2, passreg, 1, MO_64);
            tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
                tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
                break;
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_addd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mind(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            tcg_temp_free_i64(tcg_ctx, tcg_op1);
            tcg_temp_free_i64(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    } else {
        int maxpass = is_q ? 4 : 2;
        TCGv_i32 tcg_res[4];

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            NeonGenTwoOpFn *genfn = NULL;
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (is_q && (pass & 1)) ? 2 : 0;

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_32);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_32);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
            {
                static NeonGenTwoOpFn * const fns[3] = {
                    gen_helper_neon_padd_u8,
                    gen_helper_neon_padd_u16,
                    tcg_gen_add_i32,
                };
                genfn = fns[size];
                break;
            }
            case 0x14: /* SMAXP, UMAXP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmax_s8, gen_helper_neon_pmax_u8 },
                    { gen_helper_neon_pmax_s16, gen_helper_neon_pmax_u16 },
                    { tcg_gen_smax_i32, tcg_gen_umax_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            case 0x15: /* SMINP, UMINP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmin_s8, gen_helper_neon_pmin_u8 },
                    { gen_helper_neon_pmin_s16, gen_helper_neon_pmin_u16 },
                    { tcg_gen_smin_i32, tcg_gen_umin_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            /* The FP operations are all on single floats (32 bit) */
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_adds(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxs(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mins(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            /* FP ops called directly, otherwise call now */
            if (genfn) {
                genfn(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_32);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }
        clear_vec_high(s, is_q, rd);
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}